

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_move
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
          sysbvm_tuple_t destination,sysbvm_tuple_t value)

{
  sysbvm_tuple_t sVar1;
  
  if ((destination == 0) || ((*(uint *)(destination + 0x18) & 0xffff0) != 0x30)) {
    sVar1 = 0;
  }
  else {
    sVar1 = sysbvm_array_create(context,2);
    if ((sVar1 & 0xf) == 0 && sVar1 != 0) {
      *(sysbvm_tuple_t *)(sVar1 + 0x10) = destination;
      *(sysbvm_tuple_t *)(sVar1 + 0x18) = value;
    }
    sVar1 = sysbvm_functionBytecodeAssemblerInstruction_create(context,'!',sVar1);
    sysbvm_functionBytecodeAssembler_addInstruction(assembler,sVar1);
  }
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_move(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t destination, sysbvm_tuple_t value)
{
    if(!sysbvm_functionBytecodeAssembler_isLocalVectorOperand(destination))
        return SYSBVM_NULL_TUPLE;

    sysbvm_tuple_t operands = sysbvm_array_create(context, 2);
    sysbvm_array_atPut(operands, 0, destination);
    sysbvm_array_atPut(operands, 1, value);

    sysbvm_tuple_t instruction = sysbvm_functionBytecodeAssemblerInstruction_create(context, SYSBVM_OPCODE_MOVE, operands);
    sysbvm_functionBytecodeAssembler_addInstruction(assembler, instruction);
    return instruction;
}